

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system-alloc.cc
# Opt level: O3

void * TCMalloc_SystemAlloc(size_t size,size_t *actual_size,size_t alignment)

{
  LogItem b;
  LogItem c;
  LogItem d;
  int iVar1;
  undefined4 extraout_var;
  size_t sVar3;
  size_t *psVar4;
  bool bVar5;
  size_t local_60;
  size_t actual_size_storage;
  anon_union_8_4_e5b1a622_for_u_ aStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  anon_union_8_4_e5b1a622_for_u_ aStack_40;
  undefined4 local_38;
  undefined4 uStack_34;
  anon_union_8_4_e5b1a622_for_u_ aStack_30;
  SpinLockHolder local_28;
  SpinLockHolder lock_holder;
  void *pvVar2;
  
  if (CARRY8(size,alignment)) {
    pvVar2 = (void *)0x0;
  }
  else {
    local_28.lock_ = &spinlock;
    LOCK();
    bVar5 = (__atomic_base<int>)spinlock.lockword_.super___atomic_base<int>._M_i ==
            (__atomic_base<int>)0x0;
    if (bVar5) {
      spinlock.lockword_.super___atomic_base<int>._M_i = (atomic<int>)(__atomic_base<int>)0x1;
    }
    UNLOCK();
    if (!bVar5) {
      SpinLock::SlowLock(&spinlock);
    }
    if (system_alloc_inited != '\x01') {
      mmap_space.bytes_._0_8_ = &PTR__SysAllocator_001228b8;
      mmap_space.bytes_[8] = '\0';
      mmap_space.bytes_[9] = '\0';
      mmap_space.bytes_[10] = '\0';
      mmap_space.bytes_[0xb] = '\0';
      mmap_space.bytes_[0xc] = '\0';
      mmap_space.bytes_[0xd] = '\0';
      mmap_space.bytes_[0xe] = '\0';
      mmap_space.bytes_[0xf] = '\0';
      sbrk_space.bytes_ = (uint8_t  [8])&PTR__SysAllocator_00122878;
      default_space.bytes_._0_8_ = &PTR__SysAllocator_001228f8;
      default_space.bytes_[8] = '\0';
      default_space.bytes_[9] = '\0';
      default_space.bytes_._16_8_ = &sbrk_space;
      default_space.bytes_._32_8_ = sbrk_name;
      default_space.bytes_._24_8_ = &mmap_space;
      default_space.bytes_._40_8_ = mmap_name;
      tcmalloc_sys_alloc = tc_get_sysalloc_override((SysAllocator *)&default_space);
      system_alloc_inited = '\x01';
    }
    sVar3 = 0x40;
    if (0x40 < alignment) {
      sVar3 = alignment;
    }
    psVar4 = &local_60;
    if (actual_size != (size_t *)0x0) {
      psVar4 = actual_size;
    }
    iVar1 = (*tcmalloc_sys_alloc->_vptr_SysAllocator[2])(tcmalloc_sys_alloc,size,psVar4,sVar3);
    pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
    if (pvVar2 != (void *)0x0) {
      if ((long)pvVar2 + (*psVar4 - 1) >> 0x30 != 0) {
        actual_size_storage._0_4_ = 4;
        local_48 = 4;
        local_38 = 4;
        d._4_4_ = uStack_34;
        d.tag_ = 4;
        c._4_4_ = uStack_44;
        c.tag_ = 4;
        b._4_4_ = actual_size_storage._4_4_;
        b.tag_ = 4;
        b.u_.str = aStack_50.str;
        c.u_.str = aStack_40.str;
        d.u_.str = aStack_30.str;
        tcmalloc::Log(kCrash,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/system-alloc.cc"
                      ,0x197,(LogItem)(ZEXT816(0x11c0e3) << 0x40),b,c,d);
        do {
        } while( true );
      }
      TCMalloc_SystemTaken = TCMalloc_SystemTaken + *psVar4;
    }
    SpinLockHolder::~SpinLockHolder(&local_28);
  }
  return pvVar2;
}

Assistant:

void* TCMalloc_SystemAlloc(size_t size, size_t *actual_size,
                           size_t alignment) {
  // Discard requests that overflow
  if (size + alignment < size) return nullptr;

  SpinLockHolder lock_holder(&spinlock);

  if (!system_alloc_inited) {
    InitSystemAllocators();
    system_alloc_inited = true;
  }

  // Enforce minimum alignment
  if (alignment < sizeof(MemoryAligner)) alignment = sizeof(MemoryAligner);

  size_t actual_size_storage;
  if (actual_size == nullptr) {
    actual_size = &actual_size_storage;
  }

  void* result = tcmalloc_sys_alloc->Alloc(size, actual_size, alignment);
  if (result != nullptr) {
    CHECK_CONDITION(
      CheckAddressBits(reinterpret_cast<uintptr_t>(result) + *actual_size - 1));
    TCMalloc_SystemTaken += *actual_size;
  }
  return result;
}